

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale.cc
# Opt level: O0

void libyuv::ScaleAddCols1_16_C
               (int dst_width,int boxheight,int x,int dx,uint32_t *src_ptr,uint16_t *dst_ptr)

{
  uint32_t uVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  long in_R8;
  undefined2 *in_R9;
  int i;
  int scaleval;
  int boxwidth;
  int local_30;
  int local_2c;
  undefined2 *local_20;
  int local_c;
  
  local_30 = in_ECX >> 0x10;
  if (local_30 < 1) {
    local_30 = 1;
  }
  local_20 = in_R9;
  local_c = in_EDX;
  for (local_2c = 0; local_2c < in_EDI; local_2c = local_2c + 1) {
    uVar1 = SumPixels_16(local_30,(uint32_t *)(in_R8 + (long)local_c * 4));
    *local_20 = (short)(uVar1 * (int)(0x10000 / (long)(local_30 * in_ESI)) >> 0x10);
    local_c = local_30 + local_c;
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

static void ScaleAddCols1_16_C(int dst_width,
                               int boxheight,
                               int x,
                               int dx,
                               const uint32_t* src_ptr,
                               uint16_t* dst_ptr) {
  int boxwidth = MIN1(dx >> 16);
  int scaleval = 65536 / (boxwidth * boxheight);
  int i;
  for (i = 0; i < dst_width; ++i) {
    *dst_ptr++ = SumPixels_16(boxwidth, src_ptr + x) * scaleval >> 16;
    x += boxwidth;
  }
}